

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_type_createSimpleFunctionTypeWithArguments0
          (sysbvm_context_t *context,sysbvm_tuple_t resultType)

{
  sysbvm_tuple_t sVar1;
  undefined1 local_48 [8];
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_16_2_94d61efe gcFrame;
  sysbvm_tuple_t resultType_local;
  sysbvm_context_t *context_local;
  
  memset(&gcFrameRecord.roots,0,0x10);
  memset(local_48,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_BYTECODE_FUNCTION_ACTIVATION;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)local_48);
  gcFrameRecord.roots = (sysbvm_tuple_t *)sysbvm_array_create(context,0);
  sVar1 = sysbvm_type_createSimpleFunctionType
                    (context,(sysbvm_tuple_t)gcFrameRecord.roots,0,resultType);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)local_48);
  return sVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_type_createSimpleFunctionTypeWithArguments0(sysbvm_context_t *context, sysbvm_tuple_t resultType)
{
    struct {
        sysbvm_tuple_t arguments;
        sysbvm_tuple_t result;
    } gcFrame = {0};

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    gcFrame.arguments = sysbvm_array_create(context, 0);
    gcFrame.result = sysbvm_type_createSimpleFunctionType(context, gcFrame.arguments, 0, resultType);

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}